

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O3

void __thiscall
JsonArray_ArrayNoCloseBracket_Test::TestBody(JsonArray_ArrayNoCloseBracket_Test *this)

{
  parser<json_out_callbacks> *this_00;
  char *message;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  AssertHelper local_118;
  long *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  long local_100 [2];
  result_type local_f0;
  parser<json_out_callbacks> local_d0;
  
  local_100[0] = 0;
  local_100[1] = 0;
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_138 = (undefined1  [8])&local_128;
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>((string *)local_138,local_100,local_100);
  pstore::json::parser<json_out_callbacks>::parser(&local_d0,(json_out_callbacks *)local_138,none);
  if (local_138 != (undefined1  [8])&local_128) {
    operator_delete((void *)local_138,
                    CONCAT62(local_128._M_allocated_capacity._2_6_,
                             local_128._M_allocated_capacity._0_2_) + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  local_128._M_allocated_capacity._0_2_ = 0x5b;
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_138 = (undefined1  [8])&local_128;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_110,1);
  local_108 = &local_128;
  this_00 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                      (&local_d0,(span<const_char,__1L> *)&local_110);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_f0,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != (undefined1  [8])&local_128) {
    operator_delete((void *)local_138,
                    CONCAT62(local_128._M_allocated_capacity._2_6_,
                             local_128._M_allocated_capacity._0_2_) + 1);
  }
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pstore::json::get_error_category();
  local_110 = (long *)CONCAT44(local_110._4_4_,1);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_138,"p.last_error ()",
             "make_error_code (json::error_code::expected_array_member)",&local_d0.error_,
             (error_code *)&local_110);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.string_._M_dataplus._M_p != &local_d0.string_.field_2) {
    operator_delete(local_d0.string_._M_dataplus._M_p,
                    local_d0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.callbacks_.out_._M_dataplus._M_p != &local_d0.callbacks_.out_.field_2) {
    operator_delete(local_d0.callbacks_.out_._M_dataplus._M_p,
                    local_d0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_d0.stack_.c);
  if ((_Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>)
      local_d0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>)0x0) {
    operator_delete((void *)local_d0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, ArrayNoCloseBracket) {
    auto p = json::make_parser (json_out_callbacks{});
    p.input ("["s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
}